

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,CScript *script,bool include_private)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  byte in_CL;
  FlatSigningProvider *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  DescriptorScriptPubKeyMan *in_stack_00000018;
  int32_t index;
  int32_t in_stack_0000005c;
  const_iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock68;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff78;
  _Head_base<0UL,_FlatSigningProvider_*,_false> __x;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  __x._M_head_impl = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
  std::map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>::find
            ((map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
              *)in_RDI,(key_type *)in_stack_ffffffffffffff78);
  std::map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>::end
            ((map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
              *)in_RDI);
  bVar3 = std::operator==((_Self *)__x._M_head_impl,(_Self *)in_RDI);
  if (bVar3) {
    std::unique_ptr<FlatSigningProvider,std::default_delete<FlatSigningProvider>>::
    unique_ptr<std::default_delete<FlatSigningProvider>,void>
              ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
               in_stack_ffffffffffffff78,(nullptr_t)0x405ba4);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_CScript,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_CScript,_int>_> *)in_stack_ffffffffffffff78)
    ;
    GetSigningProvider(in_stack_00000018,in_stack_0000005c,in_stack_00000017);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)
             __x._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(const CScript& script, bool include_private) const
{
    LOCK(cs_desc_man);

    // Find the index of the script
    auto it = m_map_script_pub_keys.find(script);
    if (it == m_map_script_pub_keys.end()) {
        return nullptr;
    }
    int32_t index = it->second;

    return GetSigningProvider(index, include_private);
}